

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void helics::apps::loadTags(ConnectionsList *connections,json *tags)

{
  value_t vVar1;
  string_view str;
  string_view quoteChars;
  bool bVar2;
  int iVar3;
  string_type *psVar4;
  reference pbVar5;
  string_view line;
  string_view delimiters;
  stringVector tagVect;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __begin2;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __end2;
  size_t in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  delimiter_compression in_stack_fffffffffffffe88;
  undefined4 uStack_174;
  long local_168 [2];
  long *local_158;
  stringOps *local_150;
  long local_148 [2];
  ConnectionsList *local_138;
  stringVector local_130;
  iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_118;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_110;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_a0;
  
  local_118.container = tags;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::cbegin(&local_a0.anchor,tags);
  nlohmann::json_abi_v3_11_3::detail::
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  ::iteration_proxy_value(&local_110,&local_a0.anchor,0);
  nlohmann::json_abi_v3_11_3::detail::
  iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  ::end(&local_a0,&local_118);
  local_138 = connections;
  while (bVar2 = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::
                 operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                           (&local_110.anchor,&local_a0.anchor), !bVar2) {
    psVar4 = nlohmann::json_abi_v3_11_3::detail::
             iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             ::key(&local_110);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (psVar4,"tags");
    if (iVar3 == 0) {
      pbVar5 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*(&local_110.anchor);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_158,pbVar5);
      in_stack_fffffffffffffe78 = 3;
      in_stack_fffffffffffffe80 = (char *)0x447f49;
      quoteChars._M_str = (char *)0x447f49;
      quoteChars._M_len = 3;
      line._M_str = (char *)0x2;
      line._M_len = (size_t)local_158;
      delimiters._M_str = (char *)0x1;
      delimiters._M_len = (size_t)",;";
      gmlc::utilities::stringOps::splitlineQuotes_abi_cxx11_
                (&local_130,local_150,line,delimiters,quoteChars,in_stack_fffffffffffffe88);
      if (local_158 != local_148) {
        operator_delete(local_158,local_148[0] + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &connections->tagStrings,
                 (local_138->tagStrings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_130);
    }
    else {
      pbVar5 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*(&local_110.anchor);
      bVar2 = true;
      if ((pbVar5->m_data).m_type == string) {
        pbVar5 = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*(&local_110.anchor);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&stack0xfffffffffffffe88,pbVar5);
        str._M_str = in_stack_fffffffffffffe80;
        str._M_len = in_stack_fffffffffffffe78;
        bVar2 = isTrueString(str);
        if ((long *)CONCAT44(uStack_174,in_stack_fffffffffffffe88) != local_168) {
          operator_delete((long *)CONCAT44(uStack_174,in_stack_fffffffffffffe88),local_168[0] + 1);
        }
      }
      if (bVar2 != false) {
        psVar4 = nlohmann::json_abi_v3_11_3::detail::
                 iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                 ::key(&local_110);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &connections->tagStrings,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
      }
    }
    vVar1 = ((local_110.anchor.m_object)->m_data).m_type;
    if (vVar1 == array) {
      local_110.anchor.m_it.array_iterator._M_current =
           local_110.anchor.m_it.array_iterator._M_current + 1;
    }
    else if (vVar1 == object) {
      local_110.anchor.m_it.object_iterator._M_node =
           (_Base_ptr)std::_Rb_tree_increment(local_110.anchor.m_it.object_iterator._M_node);
    }
    else {
      local_110.anchor.m_it.primitive_iterator.m_it =
           local_110.anchor.m_it.primitive_iterator.m_it + 1;
    }
    local_110.array_index = local_110.array_index + 1;
  }
  nlohmann::json_abi_v3_11_3::detail::
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  ::~iteration_proxy_value(&local_a0);
  nlohmann::json_abi_v3_11_3::detail::
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  ::~iteration_proxy_value(&local_110);
  return;
}

Assistant:

static void loadTags(ConnectionsList& connections, const nlohmann::json& tags)
{
    for (const auto& val : tags.items()) {
        if (val.key() == "tags") {
            auto tagVect =
                gmlc::utilities::stringOps::splitlineQuotes(val.value().get<std::string>());
            connections.tagStrings.insert(connections.tagStrings.end(),
                                          tagVect.begin(),
                                          tagVect.end());
        } else {
            if (!val.value().is_string() || isTrueString(val.value().get<std::string>())) {
                connections.tagStrings.emplace_back(val.key());
            }
        }
    }
}